

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O2

ssize_t __thiscall cppwinrt::writer::write(writer *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  category cVar2;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t sVar3;
  ssize_t extraout_RAX_02;
  char *__n_00;
  void *__buf_00;
  basic_string_view<char,_std::char_traits<char>_> *first;
  undefined4 in_register_00000034;
  TypeDef *type;
  size_t sVar4;
  string_view __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_17;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_18;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_19;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_20;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_21;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_22;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_23;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_24;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_25;
  string_view local_158;
  string_view ns;
  undefined1 local_138 [32];
  FieldSig local_118;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> generics;
  string_view local_50;
  anon_class_16_2_560cd874 local_40;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_00;
  
  type = (TypeDef *)CONCAT44(in_register_00000034,__fd);
  add_depends(this,type);
  ns = winmd::reader::TypeDef::TypeNamespace(type);
  __x = winmd::reader::TypeDef::TypeName(type);
  local_158 = __x;
  winmd::reader::TypeDef::GenericParam(&generics,type);
  if ((generics.first.super_row_base<winmd::reader::GenericParam>.m_table !=
       generics.second.super_row_base<winmd::reader::GenericParam>.m_table) ||
     (generics.first.super_row_base<winmd::reader::GenericParam>.m_index !=
      generics.second.super_row_base<winmd::reader::GenericParam>.m_index)) {
    local_118.m_calling_convention = Property|Field;
    local_118._1_7_ = 0;
    local_118.m_cmod.
    super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x165b54;
    local_138._0_16_ = (undefined1  [16])remove_tick(&local_158);
    local_40.delimiter = &local_50;
    local_50._M_len = 2;
    local_50._M_str = ", ";
    local_40.list = (pair<winmd::reader::Field,_winmd::reader::Field> *)&generics;
    writer_base<cppwinrt::writer>::
    write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,cppwinrt::bind_list<std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>>(std::basic_string_view<char,std::char_traits<char>>const&,std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>const&)::_lambda(auto:1&)_1_>
              (&this->super_writer_base<cppwinrt::writer>,(string_view *)&local_118,&ns,
               (basic_string_view<char,_std::char_traits<char>_> *)local_138,&local_40);
    return extraout_RAX;
  }
  __y._M_str = "EventRegistrationToken";
  __y._M_len = 0x16;
  bVar1 = std::operator==(__x,__y);
  if ((bVar1) &&
     (__y_00._M_str = "Windows.Foundation", __y_00._M_len = 0x12, bVar1 = std::operator==(ns,__y_00)
     , bVar1)) {
    local_118.m_calling_convention = 0x12;
    local_118._1_7_ = 0;
    local_118.m_cmod.
    super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x165b8d;
    goto LAB_0013cd0c;
  }
  __y_01._M_str = "HResult";
  __y_01._M_len = 7;
  bVar1 = std::operator==(local_158,__y_01);
  if ((bVar1) &&
     (__y_02._M_str = "Windows.Foundation", __y_02._M_len = 0x12, bVar1 = std::operator==(ns,__y_02)
     , bVar1)) {
    local_118.m_calling_convention = Property|Field;
    local_118._1_7_ = 0;
    local_118.m_cmod.
    super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x165ba8;
    goto LAB_0013cd0c;
  }
  if (this->abi_types != true) {
    __y_05._M_str = "Windows.Foundation.Numerics";
    __y_05._M_len = 0x1b;
    bVar1 = std::operator==(ns,__y_05);
    if (bVar1) {
      __y_06._M_str = "Matrix3x2";
      __y_06._M_len = 9;
      bVar1 = std::operator==(local_158,__y_06);
      if (bVar1) {
        local_158._M_len = 8;
        local_158._M_str = "float3x2";
      }
      else {
        __y_08._M_str = "Matrix4x4";
        __y_08._M_len = 9;
        bVar1 = std::operator==(local_158,__y_08);
        if (bVar1) {
          local_158._M_len = 8;
          local_158._M_str = "float4x4";
        }
        else {
          __y_10._M_str = "Plane";
          __y_10._M_len = 5;
          bVar1 = std::operator==(local_158,__y_10);
          if (bVar1) {
            local_158._M_len = 5;
            local_158._M_str = "plane";
          }
          else {
            __y_12._M_str = "Quaternion";
            __y_12._M_len = 10;
            bVar1 = std::operator==(local_158,__y_12);
            if (bVar1) {
              local_158._M_len = 10;
              local_158._M_str = "quaternion";
            }
            else {
              __y_14._M_str = "Vector2";
              __y_14._M_len = 7;
              bVar1 = std::operator==(local_158,__y_14);
              if (bVar1) {
                local_158._M_len = 6;
                local_158._M_str = "float2";
              }
              else {
                __y_16._M_str = "Vector3";
                __y_16._M_len = 7;
                bVar1 = std::operator==(local_158,__y_16);
                if (bVar1) {
                  local_158._M_len = 6;
                  local_158._M_str = "float3";
                }
                else {
                  __y_25._M_str = "Vector4";
                  __y_25._M_len = 7;
                  bVar1 = std::operator==(local_158,__y_25);
                  if (!bVar1) goto LAB_0013ce69;
                  local_158._M_len = 6;
                  local_158._M_str = "float4";
                }
              }
            }
          }
        }
      }
    }
    goto LAB_0013ce69;
  }
  cVar2 = winmd::reader::get_category(type);
  __y_03._M_str = "Windows.Foundation.Numerics";
  __y_03._M_len = 0x1b;
  __n_00 = "Windows.Foundation.Numerics";
  bVar1 = std::operator==(ns,__y_03);
  if (bVar1) {
    sVar4 = 8;
    __y_04._M_str = "Matrix3x2";
    __y_04._M_len = 9;
    bVar1 = std::operator==(local_158,__y_04);
    if (bVar1) {
      local_158._M_str = "float3x2";
    }
    else {
      __y_07._M_str = "Matrix4x4";
      __y_07._M_len = 9;
      bVar1 = std::operator==(local_158,__y_07);
      if (bVar1) {
        local_158._M_str = "float4x4";
      }
      else {
        sVar4 = 5;
        __y_09._M_str = "Plane";
        __y_09._M_len = 5;
        bVar1 = std::operator==(local_158,__y_09);
        if (bVar1) {
          local_158._M_str = "plane";
        }
        else {
          sVar4 = 10;
          __y_11._M_str = "Quaternion";
          __y_11._M_len = 10;
          bVar1 = std::operator==(local_158,__y_11);
          if (bVar1) {
            local_158._M_str = "quaternion";
          }
          else {
            __y_13._M_str = "Vector2";
            __y_13._M_len = 7;
            bVar1 = std::operator==(local_158,__y_13);
            sVar4 = 6;
            if (bVar1) {
              local_158._M_str = "float2";
            }
            else {
              __y_15._M_str = "Vector3";
              __y_15._M_len = 7;
              bVar1 = std::operator==(local_158,__y_15);
              if (bVar1) {
                local_158._M_str = "float3";
              }
              else {
                __y_17._M_str = "Vector4";
                __y_17._M_len = 7;
                __n_00 = "Vector4";
                bVar1 = std::operator==(local_158,__y_17);
                if (!bVar1) goto LAB_0013cc44;
                local_158._M_str = "float4";
              }
            }
          }
        }
      }
    }
    local_158._M_len = sVar4;
LAB_0013ce69:
    local_118.m_cmod.
    super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x165bd3;
    local_118.m_calling_convention = 0xb;
    local_118._1_7_ = 0;
    writer_base<cppwinrt::writer>::
    write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (&this->super_writer_base<cppwinrt::writer>,(string_view *)&local_118,&ns,&local_158);
    return extraout_RAX_02;
  }
LAB_0013cc44:
  if (cVar2 == enum_type) {
    winmd::reader::TypeDef::FieldList
              ((pair<winmd::reader::Field,_winmd::reader::Field> *)local_138,type);
    winmd::reader::Field::Signature(&local_118,(Field *)local_138);
    write(this,(int)&local_118 + 0x20,__buf_00,(size_t)__n_00);
    winmd::reader::FieldSig::~FieldSig(&local_118);
    return extraout_RAX_00;
  }
  if (cVar2 == struct_type) {
    __y_18._M_str = "DateTime";
    __y_18._M_len = 8;
    bVar1 = std::operator==(local_158,__y_18);
    if (((!bVar1) &&
        (__y_19._M_str = "TimeSpan", __y_19._M_len = 8, bVar1 = std::operator==(local_158,__y_19),
        !bVar1)) ||
       (__y_20._M_str = "Windows.Foundation", __y_20._M_len = 0x12,
       bVar1 = std::operator==(ns,__y_20), !bVar1)) {
      __y_21._M_str = "Point";
      __y_21._M_len = 5;
      bVar1 = std::operator==(local_158,__y_21);
      if ((((!bVar1) &&
           (__y_22._M_str = "Size", __y_22._M_len = 4, bVar1 = std::operator==(local_158,__y_22),
           !bVar1)) &&
          (__y_23._M_str = "Rect", __y_23._M_len = 4, bVar1 = std::operator==(local_158,__y_23),
          first = extraout_RDX, !bVar1)) ||
         (__y_24._M_str = "Windows.Foundation", __y_24._M_len = 0x12,
         bVar1 = std::operator==(ns,__y_24), first = extraout_RDX_00, !bVar1)) {
        if (this->delegate_types == true) {
          local_138._8_8_ = "struct impl::struct_%_%";
          local_138._0_8_ = 0x17;
          get_impl_name<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&local_118,(cppwinrt *)&ns,first);
          writer_base<cppwinrt::writer>::
          write_segment<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                    (&this->super_writer_base<cppwinrt::writer>,(string_view *)local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118
                     ,&local_158);
        }
        else {
          local_138._8_8_ = "struct struct_%_%";
          local_138._0_8_ = 0x11;
          get_impl_name<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&local_118,(cppwinrt *)&ns,first);
          writer_base<cppwinrt::writer>::
          write_segment<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                    (&this->super_writer_base<cppwinrt::writer>,(string_view *)local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118
                     ,&local_158);
        }
        sVar3 = std::__cxx11::string::~string((string *)&local_118);
        return sVar3;
      }
      goto LAB_0013ce69;
    }
    local_118.m_calling_convention = LocalSig;
    local_118._1_7_ = 0;
    local_118.m_cmod.
    super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x166519;
  }
  else {
    local_118.m_calling_convention = VarArg;
    local_118._1_7_ = 0;
    local_118.m_cmod.
    super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x165c14;
  }
LAB_0013cd0c:
  writer_base<cppwinrt::writer>::write_impl
            (&this->super_writer_base<cppwinrt::writer>,(string_view *)&local_118);
  return extraout_RAX_01;
}

Assistant:

void write(TypeDef const& type)
        {
            add_depends(type);
            auto ns = type.TypeNamespace();
            auto name = type.TypeName();
            auto generics = type.GenericParam();

            if (!empty(generics))
            {
                write("winrt::@::%<%>", ns, remove_tick(name), bind_list(", ", generics));
                return;
            }

            if (name == "EventRegistrationToken" && ns == "Windows.Foundation")
            {
                write("winrt::event_token");
            }
            else if (name == "HResult" && ns == "Windows.Foundation")
            {
                write("winrt::hresult");
            }
            else if (abi_types)
            {
                auto category = get_category(type);

                if (ns == "Windows.Foundation.Numerics" && transform_special_numeric_type(name))
                {
                    write("winrt::@::%", ns, name);
                }
                else if (category == category::struct_type)
                {
                    if ((name == "DateTime" || name == "TimeSpan") && ns == "Windows.Foundation")
                    {
                        write("int64_t");
                    }
                    else if ((name == "Point" || name == "Size" || name == "Rect") && ns == "Windows.Foundation")
                    {
                        write("winrt::@::%", ns, name);
                    }
                    else if (delegate_types)
                    {
                        write("struct impl::struct_%_%", get_impl_name(ns), name);
                    }
                    else
                    {
                        write("struct struct_%_%", get_impl_name(ns), name);
                    }
                }
                else if (category == category::enum_type)
                {
                    write(type.FieldList().first.Signature().Type());
                }
                else
                {
                    write("void*");
                }
            }
            else
            {
                if (ns == "Windows.Foundation.Numerics")
                {
                    if (name == "Matrix3x2") { name = "float3x2"; }
                    else if (name == "Matrix4x4") { name = "float4x4"; }
                    else if (name == "Plane") { name = "plane"; }
                    else if (name == "Quaternion") { name = "quaternion"; }
                    else if (name == "Vector2") { name = "float2"; }
                    else if (name == "Vector3") { name = "float3"; }
                    else if (name == "Vector4") { name = "float4"; }

                    write("winrt::@::%", ns, name);
                }
                else
                {
                    write("winrt::@::%", ns, name);
                }
            }
        }